

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

void __thiscall
t_netstd_generator::generate_deserialize_field
          (t_netstd_generator *this,ostream *out,t_field *tfield,string *prefix,bool is_propertyless
          )

{
  pointer pcVar1;
  int iVar2;
  t_struct *tstruct;
  long *plVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  size_type *psVar6;
  long lVar7;
  char *pcVar8;
  _Alloc_hider _Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  t_base_type *this_00;
  undefined1 auVar11 [12];
  string name;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  tstruct = (t_struct *)resolve_typedef(tfield->type_);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[4])(tstruct);
  if ((char)iVar2 != '\0') {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&local_90,"CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar5,&local_90,&tfield->name_);
    __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if (is_propertyless) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0);
  }
  else {
    prop_name_abi_cxx11_(&local_b0,this,tfield,false);
  }
  plVar3 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_b0,0,(char *)0x0,(ulong)(prefix->_M_dataplus)._M_p);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90.field_2._8_8_ = plVar3[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_90._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  paVar10 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar10) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
  if (((char)iVar2 == '\0') &&
     (iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct), (char)iVar2 == '\0')
     ) {
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xd])(tstruct);
    if ((char)iVar2 != '\0') {
      paVar10 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      generate_deserialize_container(this,out,(t_type *)tstruct,&local_70);
      _Var9._M_p = local_70._M_dataplus._M_p;
      goto LAB_002c36d4;
    }
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
    if (((char)iVar2 != '\0') ||
       (iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct), (char)iVar2 != '\0'
       )) {
      t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar10) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
      if ((char)iVar2 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
        type_name_abi_cxx11_(&local_b0,this,(t_type *)tstruct,true);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar10) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"await iprot.",0xc);
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
      if ((char)iVar2 == '\0') {
        iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
        if ((char)iVar2 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(out,"ReadI32Async(",0xd);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                              CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
        }
      }
      else {
        this_00 = (t_base_type *)
                  (ulong)*(uint *)&(tstruct->members_).
                                   super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
                                   .super__Vector_impl_data._M_start;
        lVar7 = 0xe;
        switch(this_00) {
        case (t_base_type *)0x0:
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::operator+(pbVar5,"compiler error: cannot serialize void field in a struct: ",
                         &local_90);
          __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        case (t_base_type *)0x1:
          iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[7])(tstruct);
          pcVar8 = "ReadStringAsync(";
          if ((char)iVar2 != '\0') {
            pcVar8 = "ReadBinaryAsync(";
          }
          lVar7 = 0x10;
          break;
        case (t_base_type *)0x2:
          pcVar8 = "ReadBoolAsync(";
          break;
        case (t_base_type *)0x3:
          pcVar8 = "ReadByteAsync(";
          break;
        case (t_base_type *)0x4:
          lVar7 = 0xd;
          pcVar8 = "ReadI16Async(";
          break;
        case (t_base_type *)0x5:
          lVar7 = 0xd;
          pcVar8 = "ReadI32Async(";
          break;
        case (t_base_type *)0x6:
          lVar7 = 0xd;
          pcVar8 = "ReadI64Async(";
          break;
        case (t_base_type *)0x7:
          lVar7 = 0x10;
          pcVar8 = "ReadDoubleAsync(";
          break;
        default:
          auVar11 = __cxa_allocate_exception(0x20);
          t_base_type::t_base_name_abi_cxx11_(&local_b0,this_00,auVar11._8_4_);
          std::operator+(auVar11._0_8_,"compiler error: no C# name for base type ",&local_b0);
          __cxa_throw(auVar11._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,pcVar8,lVar7);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                            CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_002c36de;
    }
    pcVar1 = (tfield->name_)._M_dataplus._M_p;
    type_name_abi_cxx11_(&local_b0,this,(t_type *)tstruct,true);
    printf("DO NOT KNOW HOW TO DESERIALIZE FIELD \'%s\' TYPE \'%s\'\n",pcVar1,
           local_b0._M_dataplus._M_p);
    _Var9._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar10) goto LAB_002c36de;
  }
  else {
    paVar10 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    generate_deserialize_struct(this,out,tstruct,&local_50);
    _Var9._M_p = local_50._M_dataplus._M_p;
LAB_002c36d4:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p == paVar10) goto LAB_002c36de;
  }
  operator_delete(_Var9._M_p);
LAB_002c36de:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_deserialize_field(ostream& out, t_field* tfield, string prefix, bool is_propertyless)
{
    t_type* type = tfield->get_type();
    type = resolve_typedef( type);

    if (type->is_void())
    {
        throw "CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
    }

    string name = prefix + (is_propertyless ? "" : prop_name(tfield));

    if (type->is_struct() || type->is_xception())
    {
        generate_deserialize_struct(out, static_cast<t_struct*>(type), name);
    }
    else if (type->is_container())
    {
        generate_deserialize_container(out, type, name);
    }
    else if (type->is_base_type() || type->is_enum())
    {
        out << indent() << name << " = ";

        if (type->is_enum())
        {
            out << "(" << type_name(type) << ")";
        }

        out << "await iprot.";

        if (type->is_base_type())
        {
            t_base_type::t_base tbase = static_cast<t_base_type*>(type)->get_base();
            switch (tbase)
            {
            case t_base_type::TYPE_VOID:
                throw "compiler error: cannot serialize void field in a struct: " + name;
                break;
            case t_base_type::TYPE_STRING:
                if (type->is_binary())
                {
                    out << "ReadBinaryAsync(" << CANCELLATION_TOKEN_NAME << ");";
                }
                else
                {
                    out << "ReadStringAsync(" << CANCELLATION_TOKEN_NAME << ");";
                }
                break;
            case t_base_type::TYPE_BOOL:
                out << "ReadBoolAsync(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_I8:
                out << "ReadByteAsync(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_I16:
                out << "ReadI16Async(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_I32:
                out << "ReadI32Async(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_I64:
                out << "ReadI64Async(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_DOUBLE:
                out << "ReadDoubleAsync(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            default:
                throw "compiler error: no C# name for base type " + t_base_type::t_base_name(tbase);
            }
        }
        else if (type->is_enum())
        {
            out << "ReadI32Async(" << CANCELLATION_TOKEN_NAME << ");";
        }
        out << endl;
    }
    else
    {
        printf("DO NOT KNOW HOW TO DESERIALIZE FIELD '%s' TYPE '%s'\n", tfield->get_name().c_str(), type_name(type).c_str());
    }
}